

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void load_from_mem_sse2(sljit_compiler *compiler,sljit_s32 dst_xmm_reg,sljit_s32 src_general_reg)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 local_5 [3];
  byte local_2;
  byte local_1;
  
  if (src_general_reg < 8) {
    pbVar1 = &local_2;
    bVar2 = (byte)(dst_xmm_reg << 3) | (byte)src_general_reg;
  }
  else {
    pbVar1 = &local_1;
    bVar2 = ((byte)src_general_reg & 7) + (char)dst_xmm_reg * '\b';
  }
  *pbVar1 = bVar2;
  sljit_emit_op_custom(compiler,local_5,4);
  return;
}

Assistant:

static void load_from_mem_sse2(struct sljit_compiler *compiler, sljit_s32 dst_xmm_reg, sljit_s32 src_general_reg)
{
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
sljit_u8 instruction[5];
#else
sljit_u8 instruction[4];
#endif

SLJIT_ASSERT(dst_xmm_reg < 8);

/* MOVDQA xmm1, xmm2/m128 */
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
if (src_general_reg < 8)
  {
  instruction[0] = 0x66;
  instruction[1] = 0x0f;
  instruction[2] = 0x6f;
  instruction[3] = (dst_xmm_reg << 3) | src_general_reg;
  sljit_emit_op_custom(compiler, instruction, 4);
  }
else
  {
  instruction[0] = 0x66;
  instruction[1] = 0x41;
  instruction[2] = 0x0f;
  instruction[3] = 0x6f;
  instruction[4] = (dst_xmm_reg << 3) | (src_general_reg & 0x7);
  sljit_emit_op_custom(compiler, instruction, 4);
  }
#else
instruction[0] = 0x66;
instruction[1] = 0x0f;
instruction[2] = 0x6f;
instruction[3] = (dst_xmm_reg << 3) | src_general_reg;
sljit_emit_op_custom(compiler, instruction, 4);
#endif
}